

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

ON_Curve * __thiscall ON_Extrusion::Profile(ON_Extrusion *this,int profile_index)

{
  ON_PolyCurve *this_00;
  ON_Curve *pOVar1;
  
  if (this->m_profile_count == 1 && profile_index == 0) {
    pOVar1 = this->m_profile;
  }
  else {
    if (profile_index <= this->m_profile_count && -1 < profile_index) {
      this_00 = PolyProfile(this);
      if (this_00 != (ON_PolyCurve *)0x0) {
        pOVar1 = ON_PolyCurve::SegmentCurve(this_00,profile_index);
        return pOVar1;
      }
    }
    pOVar1 = (ON_Curve *)0x0;
  }
  return pOVar1;
}

Assistant:

const ON_Curve* ON_Extrusion::Profile(int profile_index) const
{
  if ( 0 == profile_index && 1 == m_profile_count )
    return m_profile;
  if ( profile_index < 0 || profile_index > m_profile_count )
    return 0;
  const ON_PolyCurve* poly_profile = PolyProfile();
  return ( 0 != poly_profile ? poly_profile->SegmentCurve(profile_index) : 0 );
}